

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenLine(Lexer *this)

{
  iterator __position;
  int iVar1;
  void *pvVar2;
  Token *this_00;
  Lexer *in_RSI;
  Position PStack_38;
  
  iVar1 = in_RSI->currentChar;
  nextChar(in_RSI);
  if ((int)(char)iVar1 != in_RSI->currentChar) {
    pvVar2 = memchr("\n\r",(int)(char)in_RSI->currentChar,3);
    if (pvVar2 != (void *)0x0) {
      nextChar(in_RSI);
    }
  }
  __position._M_current =
       (in_RSI->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (in_RSI->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&in_RSI->lineIndices,
               __position,&in_RSI->currentEndIndex);
  }
  else {
    *__position._M_current = in_RSI->currentEndIndex;
    (in_RSI->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  getCurrentCursor(&PStack_38,in_RSI);
  this_00 = (Token *)operator_new(0x30);
  Token::Token(this_00,in_RSI->currentToken,TOK_EOL,&PStack_38);
  this->_vptr_Lexer = (_func_int **)this_00;
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenLine() noexcept {
  char c = currentChar;
  nextChar(); // eat newline char

  // eat again if newline character (but not equal to the previous one)
  if (c != currentChar && _isNewLineCharacter(currentChar))
    nextChar();

  lineIndices.push_back(currentEndIndex);
  return std::make_unique<Token>(currentToken, TokenType::TOK_EOL, getCurrentCursor());
}